

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<float,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  
  auVar14 = ZEXT816(0);
  dVar5 = 0.0;
  dVar6 = 0.0;
  dVar7 = 0.0;
  dVar10 = 0.0;
  for (sVar4 = st; sVar4 <= end; sVar4 = sVar4 + 1) {
    dVar8 = dVar10;
    if ((uint)ABS(x[ix_arr[sVar4]]) < 0x7f800000) {
      dVar1 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[ix_arr[sVar4]];
      dVar8 = auVar14._8_8_ + dVar1;
      dVar11 = (double)x[ix_arr[sVar4]] - dVar5;
      dVar9 = dVar11 / dVar8;
      dVar11 = dVar10 * dVar9 * dVar11;
      dVar5 = dVar5 + dVar1 * dVar9;
      dVar10 = dVar9 * dVar9 * 6.0 * dVar7;
      dVar12 = dVar9 * -4.0 * dVar6;
      dVar13 = auVar14._0_8_;
      dVar6 = dVar6 + (dVar9 * -3.0 * dVar7 + (dVar8 + -2.0) * dVar9 * dVar11) * dVar1;
      dVar7 = dVar7 + dVar11 * dVar1;
      auVar14._8_8_ = dVar8;
      auVar14._0_8_ =
           (dVar12 + dVar10 + (dVar8 * dVar8 + dVar8 * -3.0 + 3.0) * dVar9 * dVar9 * dVar11) * dVar1
           + dVar13;
    }
    dVar10 = dVar8;
  }
  if ((0.0 < auVar14._8_8_) &&
     (((0x7fefffffffffffff < (ulong)ABS(dVar7) || (2.220446049250313e-16 < dVar7)) ||
      (bVar3 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,missing_action), bVar3)))) {
    auVar2._8_8_ = dVar7;
    auVar2._0_8_ = dVar7;
    auVar14 = divpd(auVar14,auVar2);
    dVar10 = auVar14._8_8_ * auVar14._0_8_;
    if ((long)ABS(dVar10) < 0x7ff0000000000000) {
      if (0.0 < dVar10) {
        return dVar10;
      }
      return 0.0;
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t ix_arr[], size_t st, size_t end, real_t x[],
                              MissingAction missing_action, mapping &restrict w)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff;
    ldouble_safe n = 0;
    ldouble_safe out;
    ldouble_safe n_prev = 0.;
    ldouble_safe w_this;

    for (size_t row = st; row <= end; row++)
    {
        if (likely(!is_na_or_inf(x[ix_arr[row]])))
        {
            w_this = w[ix_arr[row]];
            n += w_this;

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * n_prev);
            n_prev     =  n;

            m   +=  w_this * (delta_div);
            M4  +=  w_this * (diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3);
            M3  +=  w_this * (diff * delta_div * (n - 2) - 3 * delta_div * M2);
            M2  +=  w_this * (diff);
        }
    }

    if (unlikely(n <= 0)) return -HUGE_VAL;
    if (unlikely(!is_na_or_inf(M2) && M2 <= std::numeric_limits<double>::epsilon()))
    {
        if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
            return -HUGE_VAL;
    }

    out = ( M4 / M2 ) * ( n / M2 );
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}